

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_52c65e::TestCallback::fromApp
          (TestCallback *this,Message *message,SessionID *param_2)

{
  int iVar1;
  UnsupportedMessageType *this_00;
  MsgType msgType;
  string local_98;
  FieldBase local_78;
  
  FIX::StringField::StringField((StringField *)&local_78,0x23);
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003259a8;
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),&local_78);
  iVar1 = std::__cxx11::string::compare((char *)&local_78.m_string);
  if (iVar1 != 0) {
    FIX::FieldBase::~FieldBase(&local_78);
    return;
  }
  this_00 = (UnsupportedMessageType *)__cxa_allocate_exception(0x50);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  FIX::UnsupportedMessageType::UnsupportedMessageType(this_00,&local_98);
  __cxa_throw(this_00,&FIX::UnsupportedMessageType::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(FieldNotFound, IncorrectDataFormat, IncorrectTagValue, UnsupportedMessageType) {
    MsgType msgType;
    message.getHeader().getField(msgType);
    if (msgType == "8") {
      throw UnsupportedMessageType();
    }
  }